

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

ftrl_data<float> * readFromlibsvm<float>(ftrl_data<float> *__return_storage_ptr__,char *cdata)

{
  iterator __position;
  iterator __position_00;
  double dVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  uint uVar4;
  ulong uVar5;
  char *__nptr;
  undefined8 local_38;
  
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*cdata != '\0') {
    uVar4 = 0;
    bVar2 = 0x20;
    __nptr = cdata;
    local_38 = in_RAX;
    do {
      if (bVar2 == 0x20) {
        if (cdata[uVar4 + 1] == '\n') {
          return __return_storage_ptr__;
        }
        iVar3 = atoi(__nptr);
        local_38 = CONCAT44(iVar3 - 1U,(float)local_38);
        __position._M_current =
             (__return_storage_ptr__->indexs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->indexs).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&__return_storage_ptr__->indexs,__position,(uint *)((long)&local_38 + 4));
        }
        else {
          *__position._M_current = iVar3 - 1U;
          (__return_storage_ptr__->indexs).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        while( true ) {
          uVar5 = (ulong)uVar4;
          bVar2 = cdata[uVar5];
          if ((bVar2 == 0) || (bVar2 == 0x3a)) break;
          uVar4 = uVar4 + 1;
        }
      }
      else {
        dVar1 = atof(__nptr + 1);
        local_38 = CONCAT44(local_38._4_4_,(float)dVar1);
        __position_00._M_current =
             (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&__return_storage_ptr__->data,__position_00,(float *)&local_38);
        }
        else {
          *__position_00._M_current = (float)dVar1;
          (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
        while( true ) {
          uVar5 = (ulong)uVar4;
          bVar2 = cdata[uVar5];
          if ((bVar2 & 0xdf) == 0) break;
          uVar4 = uVar4 + 1;
        }
      }
      __nptr = cdata + uVar5;
    } while (bVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

ftrl_data<T> readFromlibsvm(const char * cdata) {
    unsigned int begin = 0;
    ftrl_data<T> data;
    char prefix = ' ';
    while (cdata[begin] != '\0') {
        if (prefix == ' ') {
            if (cdata[begin + 1] == '\n') { //if there is a \n after a space, then we go to next line
                break;
            }
            data.indexs.push_back((unsigned int)atoi(cdata + begin) - 1);
            while (cdata[begin] != '\0' && cdata[begin] != ':') {
                ++begin;
            }
        } else {
            data.data.push_back((float)atof(cdata + begin + 1));
            while (cdata[begin] != '\0' && cdata[begin] != ' ') {
                ++begin;
            }
        }
        prefix = cdata[begin];
    }
    return data;
}